

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slider.cpp
# Opt level: O2

void __thiscall gui::Slider::draw(Slider *this,RenderTarget *target,RenderStates states)

{
  undefined8 uVar1;
  element_type *peVar2;
  element_type *drawable;
  float fVar3;
  bool bVar4;
  Transform *right;
  Color *color;
  float fVar5;
  Color local_2c;
  Vector2f local_28;
  
  bVar4 = Widget::isVisible(&this->super_Widget);
  if (bVar4) {
    right = Widget::getTransform(&this->super_Widget);
    sf::operator*=(&states.transform,right);
    fVar5 = getThumbWidth(this);
    sf::RectangleShape::setSize
              (&((this->style_).super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->rect_,&this->size_);
    bVar4 = Widget::isMouseHovering(&this->super_Widget);
    peVar2 = (this->style_).super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (bVar4) {
      local_2c = Style::blendColors(&peVar2->colorRectHover_,&peVar2->colorRect_);
      color = &local_2c;
    }
    else {
      color = &peVar2->colorRect_;
    }
    sf::Shape::setFillColor(&(peVar2->rect_).super_Shape,color);
    sf::RenderTarget::draw
              (target,(Drawable *)
                      &((this->style_).
                        super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       rect_,&states);
    local_28.y = (this->size_).y;
    local_28.x = fVar5;
    sf::RectangleShape::setSize
              (&((this->style_).super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->thumb_,&local_28);
    fVar3 = (this->range_).first;
    uVar1 = *(undefined8 *)&(this->range_).second;
    sf::Transformable::setPosition
              (&(((this->style_).super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr)->thumb_).super_Shape.super_Transformable,
               ((this->size_).x - fVar5) *
               (((float)((ulong)uVar1 >> 0x20) - fVar3) / ((float)uVar1 - fVar3)),0.0);
    peVar2 = (this->style_).super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    sf::Shape::setFillColor(&(peVar2->thumb_).super_Shape,&peVar2->colorThumb_ + this->isDragging_);
    sf::RenderTarget::draw
              (target,(Drawable *)
                      &((this->style_).
                        super___shared_ptr<gui::SliderStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       thumb_,&states);
    drawable = (this->label_).super___shared_ptr<gui::Label,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if (drawable != (element_type *)0x0) {
      sf::RenderTarget::draw(target,(Drawable *)drawable,&states);
    }
  }
  return;
}

Assistant:

void Slider::draw(sf::RenderTarget& target, sf::RenderStates states) const {
    if (!isVisible()) {
        return;
    }
    states.transform *= getTransform();

    const float thumbWidth = getThumbWidth();

    style_->rect_.setSize(size_);
    if (isMouseHovering()) {
        style_->rect_.setFillColor(Style::blendColors(style_->colorRectHover_, style_->colorRect_));
    } else {
        style_->rect_.setFillColor(style_->colorRect_);
    }
    target.draw(style_->rect_, states);
    style_->thumb_.setSize({thumbWidth, size_.y});
    style_->thumb_.setPosition((value_ - range_.first) / (range_.second - range_.first) * (size_.x - thumbWidth), 0.0f);
    style_->thumb_.setFillColor(isDragging_ ? style_->colorThumbDown_ : style_->colorThumb_);
    target.draw(style_->thumb_, states);

    if (label_ != nullptr) {
        target.draw(*label_, states);
    }
}